

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocketclient.cpp
# Opt level: O2

void __thiscall session::LoopWrite(session *this)

{
  string WSmessage;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [16];
  mutable_buffers_1 local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
  local_38;
  
  if ((accepting) ||
     (requests_abi_cxx11_.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      requests_abi_cxx11_.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    local_78 = local_68;
    local_70 = (undefined1 *)0x0;
    local_68[0] = 0;
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&requests_abi_cxx11_.c);
    writing = true;
    local_58.super_mutable_buffer.data_ = local_70;
    if (local_70 != (undefined1 *)0x0) {
      local_58.super_mutable_buffer.data_ = local_78;
    }
    local_58.super_mutable_buffer.size_ = (size_t)local_70;
    std::__shared_ptr<session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<session,void>
              ((__shared_ptr<session,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<session,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_38.h_ = (offset_in_session_to_subr)on_write;
    local_38._8_8_ = 0;
    local_38.args_.
    super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
    super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
    super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    local_38.args_.
    super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
    super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
    super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_40._M_pi;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::beast::websocket::
    stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
    ::
    async_write<boost::asio::mutable_buffers_1,boost::beast::detail::bind_front_wrapper<void(session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<session>>>
              ((stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
                *)&this->ws_,&local_58,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_38.args_.
                       super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>
                       .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
                       super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2> + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void
session::LoopWrite() {
    if (!accepting && requests.empty()) {
#ifdef DEBUG_PRINT
        std::clog << "Not accepting!" << std::endl;
#endif
        return;
    }

    std::string WSmessage;

    try {
        WSmessage = requests.front();
        requests.pop();
#ifdef DEBUG_PRINT
        std::clog << "> Write \"" << WSmessage << "\"" << std::endl;
#endif
    } catch (...) {
        WSmessage = "";
#ifdef DEBUG_PRINT
        std::clog << "> Write queue is empty" << std::endl;
#endif
    }

    writing = true;

    ws_.async_write(
            net::buffer(WSmessage),
            beast::bind_front_handler(
                    &session::on_write,
                    shared_from_this()));
}